

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O0

size_t __thiscall
axl::err::Error::formatStringError_va(Error *this,char *formatString,axl_va_list *va)

{
  size_t sVar1;
  size_t in_RDX;
  axl_va_list *in_RDI;
  String string;
  char buffer [256];
  axl_va_list *in_stack_fffffffffffffe78;
  void *in_stack_fffffffffffffe90;
  BufKind in_stack_fffffffffffffe9c;
  StringRef *in_stack_fffffffffffffea0;
  Error *in_stack_fffffffffffffea8;
  axl_va_list *in_stack_ffffffffffffff18;
  C *in_stack_ffffffffffffff20;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff28;
  
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90,in_RDX);
  axl_va_list::axl_va_list(in_RDI,in_stack_fffffffffffffe78);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::format_va
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  axl_va_list::~axl_va_list((axl_va_list *)0x17bb75);
  sVar1 = createStringError(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x17bb94);
  return sVar1;
}

Assistant:

size_t
Error::formatStringError_va(
	const char* formatString,
	axl_va_list va
) {
	char buffer[256];
	sl::String string(rc::BufKind_Stack, buffer, sizeof(buffer));
	string.format_va(formatString, va);
	return createStringError(string);
}